

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O2

QByteArray *
QStringAlgorithms<QByteArray>::simplified_helper(QByteArray *__return_storage_ptr__,QByteArray *str)

{
  byte bVar1;
  undefined1 *size;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  QTypedArrayData<char> *__old_val;
  byte *pbVar5;
  byte *pbVar6;
  char *__old_val_1;
  byte *pbVar7;
  longlong __old_val_2;
  byte *pbVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  size = (undefined1 *)(str->d).size;
  if (size == (undefined1 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
      return __return_storage_ptr__;
    }
LAB_002d5168:
    __stack_chk_fail();
  }
  pbVar6 = (byte *)(str->d).ptr;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (str->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    QByteArray::QByteArray((QByteArray *)&local_48,(qsizetype)size,Uninitialized);
  }
  else {
    (str->d).d = (Data *)0x0;
    (str->d).ptr = (char *)0x0;
    (str->d).size = 0;
    local_48.d = pDVar2;
    local_48.ptr = (char *)pbVar6;
    local_48.size = (qsizetype)size;
  }
  pbVar8 = pbVar6 + (long)size;
  pbVar5 = (byte *)local_48.ptr;
  do {
    while (((pbVar7 = pbVar8, pbVar6 != pbVar8 && (pbVar7 = pbVar6, *pbVar6 < 0x40)) &&
           ((1L << (*pbVar6 & 0x3f) & 0x100003e00U) != 0))) {
      pbVar6 = pbVar6 + 1;
    }
    while( true ) {
      if (pbVar7 == pbVar8) {
        pbVar6 = (byte *)local_48.ptr;
        if ((pbVar5 != (byte *)local_48.ptr) && (pbVar6 = pbVar5 + -1, pbVar5[-1] != 0x20)) {
          pbVar6 = pbVar5;
        }
        QByteArray::resize((QByteArray *)&local_48,(long)pbVar6 - (long)local_48.ptr);
        qVar4 = local_48.size;
        pcVar3 = local_48.ptr;
        pDVar2 = local_48.d;
        local_48.d = (Data *)0x0;
        local_48.ptr = (char *)0x0;
        (__return_storage_ptr__->d).d = pDVar2;
        (__return_storage_ptr__->d).ptr = pcVar3;
        local_48.size = 0;
        (__return_storage_ptr__->d).size = qVar4;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return __return_storage_ptr__;
        }
        goto LAB_002d5168;
      }
      bVar1 = *pbVar7;
      if ((bVar1 < 0x40) && ((1L << (bVar1 & 0x3f) & 0x100003e00U) != 0)) break;
      *pbVar5 = bVar1;
      pbVar5 = pbVar5 + 1;
      pbVar7 = pbVar7 + 1;
    }
    *pbVar5 = 0x20;
    pbVar5 = pbVar5 + 1;
    pbVar6 = pbVar7;
  } while( true );
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }